

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_renumber.cc
# Opt level: O2

bool compare(QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  ostream *poVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_a;
  _Rb_tree_node_base local_c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_b;
  size_type local_98;
  QPDFObjectHandle local_70;
  string local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((compare(QPDFObjectHandle,QPDFObjectHandle)::visited == '\0') &&
     (iVar4 = __cxa_guard_acquire(&compare(QPDFObjectHandle,QPDFObjectHandle)::visited), iVar4 != 0)
     ) {
    compare::visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    compare::visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    compare::visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &compare::visited._M_t._M_impl.super__Rb_tree_header._M_header;
    compare::visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &compare::visited._M_t._M_impl.super__Rb_tree_header._M_header;
    compare::visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set,
                 &compare::visited,&__dso_handle);
    __cxa_guard_release(&compare(QPDFObjectHandle,QPDFObjectHandle)::visited);
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    _keys_a = (key_type)QPDFObjectHandle::getObjGen();
    sVar7 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                      (&compare::visited,(key_type *)&keys_a);
    if (sVar7 != 0) {
      return true;
    }
    _keys_a = (key_type)QPDFObjectHandle::getObjGen();
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::_M_insert_unique<QPDFObjGen>(&compare::visited._M_t,(QPDFObjGen *)&keys_a);
  }
  iVar4 = QPDFObjectHandle::getTypeCode();
  iVar5 = QPDFObjectHandle::getTypeCode();
  if (iVar4 != iVar5) {
    pcVar10 = "different type code";
    goto LAB_001036aa;
  }
  uVar6 = QPDFObjectHandle::getTypeCode();
  bVar3 = true;
  switch(uVar6) {
  case 2:
    goto switchD_00103673_caseD_2;
  case 3:
    cVar1 = QPDFObjectHandle::getBoolValue();
    cVar2 = QPDFObjectHandle::getBoolValue();
    if (cVar1 == cVar2) {
      return true;
    }
    pcVar10 = "different boolean";
    break;
  case 4:
    lVar11 = QPDFObjectHandle::getIntValue();
    lVar12 = QPDFObjectHandle::getIntValue();
    if (lVar11 == lVar12) {
      return true;
    }
    pcVar10 = "different integer";
    break;
  case 5:
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &keys_a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_a);
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different real";
    break;
  case 6:
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &keys_a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_a);
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different string";
    break;
  case 7:
    QPDFObjectHandle::getName_abi_cxx11_();
    QPDFObjectHandle::getName_abi_cxx11_();
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &keys_a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_b);
    std::__cxx11::string::~string((string *)&keys_a);
    if (!bVar3) {
      return true;
    }
    pcVar10 = "different name";
    break;
  case 8:
    QPDFObjectHandle::getArrayAsVector();
    QPDFObjectHandle::getArrayAsVector();
    if (local_c8._0_8_ - (long)_keys_a == local_98 - (long)_keys_b) {
      lVar11 = (local_c8._0_8_ - (long)_keys_a >> 4) + 1;
      lVar12 = 0;
      do {
        lVar11 = lVar11 + -1;
        if (lVar11 == 0) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&keys_b);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&keys_a);
          return true;
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)((long)_keys_a + lVar12))
        ;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(_keys_b + lVar12));
        bVar3 = compare((QPDFObjectHandle *)&local_40,(QPDFObjectHandle *)&local_50);
        lVar12 = lVar12 + 0x10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      } while (bVar3);
      poVar9 = std::operator<<((ostream *)&std::cerr,"different array item");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different array size");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&keys_b);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&keys_a);
    goto LAB_001036b7;
  case 9:
    QPDFObjectHandle::getKeys_abi_cxx11_();
    QPDFObjectHandle::getKeys_abi_cxx11_();
    bVar3 = std::operator!=(&keys_a,&keys_b);
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different dictionary keys");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      p_Var8 = local_c8._M_left;
      while( true ) {
        if (p_Var8 == &local_c8) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&keys_b);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&keys_a);
          return true;
        }
        QPDFObjectHandle::getKey((string *)&local_70);
        QPDFObjectHandle::getKey(local_60);
        bVar3 = compare(&local_70,(QPDFObjectHandle *)local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_70.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (!bVar3) break;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"different dictionary item");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&keys_b);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&keys_a);
    goto LAB_001036b7;
  case 10:
    poVar9 = std::operator<<((ostream *)&std::cout,"stream objects are not compared");
    std::endl<char,std::char_traits<char>>(poVar9);
    return true;
  default:
    poVar9 = std::operator<<((ostream *)&std::cerr,"unknown object type");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(2);
  }
LAB_001036aa:
  poVar9 = std::operator<<((ostream *)&std::cerr,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_001036b7:
  bVar3 = false;
switchD_00103673_caseD_2:
  return bVar3;
}

Assistant:

bool
compare(QPDFObjectHandle a, QPDFObjectHandle b)
{
    static std::set<QPDFObjGen> visited;
    if (a.isIndirect()) {
        if (visited.count(a.getObjGen())) {
            return true;
        }
        visited.insert(a.getObjGen());
    }

    if (a.getTypeCode() != b.getTypeCode()) {
        std::cerr << "different type code" << std::endl;
        return false;
    }

    switch (a.getTypeCode()) {
    case ::ot_boolean:
        if (a.getBoolValue() != b.getBoolValue()) {
            std::cerr << "different boolean" << std::endl;
            return false;
        }
        break;
    case ::ot_integer:
        if (a.getIntValue() != b.getIntValue()) {
            std::cerr << "different integer" << std::endl;
            return false;
        }
        break;
    case ::ot_real:
        if (a.getRealValue() != b.getRealValue()) {
            std::cerr << "different real" << std::endl;
            return false;
        }
        break;
    case ::ot_string:
        if (a.getStringValue() != b.getStringValue()) {
            std::cerr << "different string" << std::endl;
            return false;
        }
        break;
    case ::ot_name:
        if (a.getName() != b.getName()) {
            std::cerr << "different name" << std::endl;
            return false;
        }
        break;
    case ::ot_array:
        {
            std::vector<QPDFObjectHandle> objs_a = a.getArrayAsVector();
            std::vector<QPDFObjectHandle> objs_b = b.getArrayAsVector();
            size_t items = objs_a.size();
            if (items != objs_b.size()) {
                std::cerr << "different array size" << std::endl;
                return false;
            }

            for (size_t i = 0; i < items; ++i) {
                if (!compare(objs_a[i], objs_b[i])) {
                    std::cerr << "different array item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_dictionary:
        {
            std::set<std::string> keys_a = a.getKeys();
            std::set<std::string> keys_b = b.getKeys();
            if (keys_a != keys_b) {
                std::cerr << "different dictionary keys" << std::endl;
                return false;
            }

            for (auto const& key: keys_a) {
                if (!compare(a.getKey(key), b.getKey(key))) {
                    std::cerr << "different dictionary item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_null:
        break;
    case ::ot_stream:
        std::cout << "stream objects are not compared" << std::endl;
        break;
    default:
        std::cerr << "unknown object type" << std::endl;
        std::exit(2);
    }

    return true;
}